

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void deserialize_node<_IO_FILE*,int,unsigned_int>
               (IsoTree *node,_IO_FILE **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian)

{
  uint8_t data_en;
  size_t data_sizets [4];
  double data_doubles [6];
  
  if (!interrupt_switch) {
    read_bytes<unsigned_char>(&data_en,1,in);
    node->col_type = (uint)data_en;
    read_bytes<int,int>(&node->chosen_cat,1,in,buffer,diff_endian);
    read_bytes<double,double>(data_doubles,6,in,buffer,diff_endian);
    node->num_split = data_doubles[0];
    node->pct_tree_left = data_doubles[1];
    node->score = data_doubles[2];
    node->range_low = data_doubles[3];
    node->range_high = data_doubles[4];
    node->remainder = data_doubles[5];
    read_bytes<unsigned_long,unsigned_int>(data_sizets,4,in,buffer,diff_endian);
    node->col_num = data_sizets[0];
    node->tree_left = data_sizets[1];
    node->tree_right = data_sizets[2];
    read_bytes<signed_char>(&node->cat_split,data_sizets[3],in);
  }
  return;
}

Assistant:

void deserialize_node(IsoTree &node, itype &in, std::vector<char> &buffer, const bool diff_endian)
{
    if (interrupt_switch) return;

    uint8_t data_en;
    read_bytes<uint8_t>((void*)&data_en, (size_t)1, in);
    node.col_type = (ColType)data_en;

    read_bytes<int, saved_int_t>((void*)&node.chosen_cat, (size_t)1, in, buffer, diff_endian);

    double data_doubles[6];
    read_bytes<double, double>((void*)data_doubles, (size_t)6, in, buffer, diff_endian);
    node.num_split = data_doubles[0];
    node.pct_tree_left = data_doubles[1];
    node.score = data_doubles[2];
    node.range_low = data_doubles[3];
    node.range_high = data_doubles[4];
    node.remainder = data_doubles[5];

    size_t data_sizets[4];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)4, in, buffer, diff_endian);
    node.col_num = data_sizets[0];
    node.tree_left = data_sizets[1];
    node.tree_right = data_sizets[2];
    read_bytes<signed char, signed char>(node.cat_split, data_sizets[3], in, buffer, diff_endian);
}